

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.h
# Opt level: O0

void duckdb_zstd::MEM_writeLE16(void *memPtr,U16 val)

{
  uint uVar1;
  U16 in_SI;
  undefined1 *in_RDI;
  BYTE *p;
  
  uVar1 = MEM_isLittleEndian();
  if (uVar1 == 0) {
    *in_RDI = (char)in_SI;
    in_RDI[1] = (char)(in_SI >> 8);
  }
  else {
    MEM_write16(in_RDI,in_SI);
  }
  return;
}

Assistant:

MEM_STATIC void MEM_writeLE16(void* memPtr, U16 val)
{
    if (MEM_isLittleEndian()) {
        MEM_write16(memPtr, val);
    } else {
        BYTE* p = (BYTE*)memPtr;
        p[0] = (BYTE)val;
        p[1] = (BYTE)(val>>8);
    }
}